

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ClosePopupToLevel(int remaining,bool restore_focus_to_window_under_popup)

{
  ImGuiPopupData *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  
  pIVar2 = GImGui;
  if ((GImGui->DebugLogFlags & 4) != 0) {
    DebugLog("[popup] ClosePopupToLevel(%d), restore_focus_to_window_under_popup=%d\n",
             (ulong)(uint)remaining,(ulong)restore_focus_to_window_under_popup);
  }
  pIVar1 = (pIVar2->OpenPopupStack).Data;
  pIVar3 = pIVar1[remaining].Window;
  pIVar4 = pIVar1[remaining].BackupNavWindow;
  ImVector<ImGuiPopupData>::resize(&pIVar2->OpenPopupStack,remaining);
  if (!restore_focus_to_window_under_popup) {
    return;
  }
  if ((pIVar3 != (ImGuiWindow *)0x0) && ((pIVar3->Flags & 0x10000000) != 0)) {
    pIVar4 = pIVar3->ParentWindow;
  }
  if (pIVar4 == (ImGuiWindow *)0x0) {
    pIVar3 = (ImGuiWindow *)0x0;
  }
  else {
    if ((pIVar3 != (ImGuiWindow *)0x0) && (pIVar4->WasActive == false)) {
      FocusTopMostWindowUnderOne(pIVar3,(ImGuiWindow *)0x0);
      return;
    }
    if (((pIVar2->NavLayer != ImGuiNavLayer_Main) ||
        (pIVar3 = pIVar4->NavLastChildNavWindow, pIVar3 == (ImGuiWindow *)0x0)) ||
       (pIVar3->WasActive == false)) {
      pIVar3 = pIVar4;
    }
  }
  FocusWindow(pIVar3);
  return;
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    IMGUI_DEBUG_LOG_POPUP("[popup] ClosePopupToLevel(%d), restore_focus_to_window_under_popup=%d\n", remaining, restore_focus_to_window_under_popup);
    IM_ASSERT(remaining >= 0 && remaining < g.OpenPopupStack.Size);

    // Trim open popup stack
    ImGuiWindow* popup_window = g.OpenPopupStack[remaining].Window;
    ImGuiWindow* popup_backup_nav_window = g.OpenPopupStack[remaining].BackupNavWindow;
    g.OpenPopupStack.resize(remaining);

    if (restore_focus_to_window_under_popup)
    {
        ImGuiWindow* focus_window = (popup_window && popup_window->Flags & ImGuiWindowFlags_ChildMenu) ? popup_window->ParentWindow : popup_backup_nav_window;
        if (focus_window && !focus_window->WasActive && popup_window)
        {
            // Fallback
            FocusTopMostWindowUnderOne(popup_window, NULL);
        }
        else
        {
            if (g.NavLayer == ImGuiNavLayer_Main && focus_window)
                focus_window = NavRestoreLastChildNavWindow(focus_window);
            FocusWindow(focus_window);
        }
    }
}